

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
libcellml::Parser::ParserImpl::loadUnit(ParserImpl *this,UnitsPtr *units,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  allocator<char> local_a91;
  string local_a90;
  undefined1 local_a70 [8];
  IssuePtr issue_7;
  string local_a50;
  string local_a30;
  string local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  undefined1 local_930 [8];
  IssuePtr issue_6;
  string local_900;
  string local_8e0;
  string local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  undefined1 local_7e0 [8];
  IssuePtr issue_5;
  string local_7b0;
  string local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  undefined1 local_6b0 [8];
  IssuePtr issue_4;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  undefined1 local_540 [8];
  IssuePtr issue_3;
  string local_510;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  undefined1 local_410 [8];
  IssuePtr issue_2;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  byte local_339;
  undefined1 local_338 [7];
  bool unitsAttributePresent;
  XmlAttributePtr attribute;
  string local_318;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  IssuePtr issue_1;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  IssuePtr issue;
  string textNode;
  XmlNodePtr childNode;
  string id;
  double multiplier;
  double exponent;
  allocator<char> local_61;
  undefined1 local_60 [8];
  string prefix;
  string reference;
  XmlNodePtr *node_local;
  UnitsPtr *units_local;
  ParserImpl *this_local;
  
  std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"0",&local_61);
  std::allocator<char>::~allocator(&local_61);
  multiplier = 1.0;
  id.field_2._8_8_ = 0x3ff0000000000000;
  std::__cxx11::string::string
            ((string *)
             &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)((long)&textNode.field_2 + 8));
  while (bVar2 = std::operator!=((shared_ptr<libcellml::XmlNode> *)((long)&textNode.field_2 + 8),
                                 (nullptr_t)0x0), bVar2) {
    peVar4 = std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(textNode.field_2._M_local_buf + 8));
    bVar2 = XmlNode::isText(peVar4);
    if (bVar2) {
      peVar4 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(textNode.field_2._M_local_buf + 8));
      XmlNode::convertToString_abi_cxx11_
                ((string *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ,peVar4);
      bVar2 = hasNonWhitespaceCharacters
                        ((string *)
                         &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar2) {
        Issue::IssueImpl::create();
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e8);
        pIVar1 = peVar5->mPimpl;
        peVar4 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
        XmlNode::attribute_abi_cxx11_(&local_1c8,peVar4,"units");
        std::operator+(&local_1a8,"Unit referencing \'",&local_1c8);
        std::operator+(&local_188,&local_1a8,"\' in units \'");
        peVar7 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        NamedEntity::name_abi_cxx11_
                  ((string *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&peVar7->super_NamedEntity);
        std::operator+(&local_168,&local_188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_148,&local_168,
                       "\' has an invalid non-whitespace child text element \'");
        std::operator+(&local_128,&local_148,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
        std::operator+(&local_108,&local_128,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string
                  ((string *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1c8);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e8);
        peVar6 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar5->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar6->mPimpl,units);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_e8);
        Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_e8);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_e8);
      }
      std::__cxx11::string::~string
                ((string *)
                 &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    else {
      peVar4 = std::
               __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(textNode.field_2._M_local_buf + 8));
      bVar2 = XmlNode::isComment(peVar4);
      if (!bVar2) {
        Issue::IssueImpl::create();
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1f8);
        pIVar1 = peVar5->mPimpl;
        peVar4 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)node);
        XmlNode::attribute_abi_cxx11_(&local_2d8,peVar4,"units");
        std::operator+(&local_2b8,"Unit referencing \'",&local_2d8);
        std::operator+(&local_298,&local_2b8,"\' in units \'");
        peVar7 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)units);
        NamedEntity::name_abi_cxx11_(&local_2f8,&peVar7->super_NamedEntity);
        std::operator+(&local_278,&local_298,&local_2f8);
        std::operator+(&local_258,&local_278,"\' has an invalid child element \'");
        peVar4 = std::
                 __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(textNode.field_2._M_local_buf + 8));
        XmlNode::name_abi_cxx11_(&local_318,peVar4);
        std::operator+(&local_238,&local_258,&local_318);
        std::operator+(&local_218,&local_238,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_238);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1f8);
        peVar6 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar5->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar6->mPimpl,units);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1f8);
        Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,XML_UNEXPECTED_ELEMENT);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_1f8);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_1f8);
      }
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               (textNode.field_2._M_local_buf + 8));
    XmlNode::next((XmlNode *)
                  &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)((long)&textNode.field_2 + 8),
               (shared_ptr<libcellml::XmlNode> *)
               &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr
              ((shared_ptr<libcellml::XmlNode> *)
               &attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstAttribute((XmlNode *)local_338);
  local_339 = 0;
  while (bVar2 = std::operator!=((shared_ptr<libcellml::XmlAttribute> *)local_338,(nullptr_t)0x0),
        bVar2) {
    peVar3 = std::
             __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_338);
    bVar2 = XmlAttribute::isType(peVar3,"units","");
    if (bVar2) {
      if ((this->mParsing1XVersion & 1U) == 0) {
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_338);
        XmlAttribute::value_abi_cxx11_(&local_3a0,peVar3);
        std::__cxx11::string::operator=
                  ((string *)(prefix.field_2._M_local_buf + 8),(string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_3a0);
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_338);
        XmlAttribute::value_abi_cxx11_(&local_380,peVar3);
        convertNonSiUnits(&local_360,&local_380);
        std::__cxx11::string::operator=
                  ((string *)(prefix.field_2._M_local_buf + 8),(string *)&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::string::~string((string *)&local_380);
      }
      local_339 = 1;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_338);
      bVar2 = XmlAttribute::isType(peVar3,"prefix","");
      if (bVar2) {
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_338);
        XmlAttribute::value_abi_cxx11_(&local_3c0,peVar3);
        std::__cxx11::string::operator=((string *)local_60,(string *)&local_3c0);
        std::__cxx11::string::~string((string *)&local_3c0);
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_338);
        bVar2 = XmlAttribute::isType(peVar3,"exponent","");
        if (bVar2) {
          peVar3 = std::
                   __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_338);
          XmlAttribute::value_abi_cxx11_(&local_3e0,peVar3);
          bVar2 = isCellMLReal(&local_3e0);
          std::__cxx11::string::~string((string *)&local_3e0);
          if (bVar2) {
            peVar3 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_338);
            XmlAttribute::value_abi_cxx11_
                      ((string *)
                       &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,peVar3);
            bVar2 = convertToDouble((string *)
                                    &issue_2.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount,&multiplier);
            std::__cxx11::string::~string
                      ((string *)
                       &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              Issue::IssueImpl::create();
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_410);
              pIVar1 = peVar5->mPimpl;
              peVar4 = std::
                       __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)node);
              XmlNode::attribute_abi_cxx11_(&local_4f0,peVar4,"units");
              std::operator+(&local_4d0,"Unit referencing \'",&local_4f0);
              std::operator+(&local_4b0,&local_4d0,"\' in units \'");
              peVar7 = std::
                       __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)units);
              NamedEntity::name_abi_cxx11_(&local_510,&peVar7->super_NamedEntity);
              std::operator+(&local_490,&local_4b0,&local_510);
              std::operator+(&local_470,&local_490,"\' has an exponent with the value \'");
              peVar3 = std::
                       __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_338);
              XmlAttribute::value_abi_cxx11_
                        ((string *)
                         &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,peVar3);
              std::operator+(&local_450,&local_470,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &issue_3.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
              std::operator+(&local_430,&local_450,
                             "\' that is a representation of a CellML real valued number, but out of range of the \'double\' type."
                            );
              Issue::IssueImpl::setDescription(pIVar1,&local_430);
              std::__cxx11::string::~string((string *)&local_430);
              std::__cxx11::string::~string((string *)&local_450);
              std::__cxx11::string::~string
                        ((string *)
                         &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__cxx11::string::~string((string *)&local_470);
              std::__cxx11::string::~string((string *)&local_490);
              std::__cxx11::string::~string((string *)&local_510);
              std::__cxx11::string::~string((string *)&local_4b0);
              std::__cxx11::string::~string((string *)&local_4d0);
              std::__cxx11::string::~string((string *)&local_4f0);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_410);
              peVar6 = std::
                       __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar5->mPimpl->mItem);
              AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar6->mPimpl,units);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_410);
              Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,UNIT_ATTRIBUTE_EXPONENT_VALUE);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_410);
              std::shared_ptr<libcellml::Issue>::~shared_ptr
                        ((shared_ptr<libcellml::Issue> *)local_410);
            }
          }
          else {
            Issue::IssueImpl::create();
            peVar5 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_540);
            pIVar1 = peVar5->mPimpl;
            peVar4 = std::
                     __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)node);
            XmlNode::attribute_abi_cxx11_(&local_620,peVar4,"units");
            std::operator+(&local_600,"Unit referencing \'",&local_620);
            std::operator+(&local_5e0,&local_600,"\' in units \'");
            peVar7 = std::
                     __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)units);
            NamedEntity::name_abi_cxx11_(&local_640,&peVar7->super_NamedEntity);
            std::operator+(&local_5c0,&local_5e0,&local_640);
            std::operator+(&local_5a0,&local_5c0,"\' has an exponent with the value \'");
            peVar3 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_338);
            XmlAttribute::value_abi_cxx11_(&local_660,peVar3);
            std::operator+(&local_580,&local_5a0,&local_660);
            std::operator+(&local_560,&local_580,
                           "\' that is not a representation of a CellML real valued number.");
            Issue::IssueImpl::setDescription(pIVar1,&local_560);
            std::__cxx11::string::~string((string *)&local_560);
            std::__cxx11::string::~string((string *)&local_580);
            std::__cxx11::string::~string((string *)&local_660);
            std::__cxx11::string::~string((string *)&local_5a0);
            std::__cxx11::string::~string((string *)&local_5c0);
            std::__cxx11::string::~string((string *)&local_640);
            std::__cxx11::string::~string((string *)&local_5e0);
            std::__cxx11::string::~string((string *)&local_600);
            std::__cxx11::string::~string((string *)&local_620);
            peVar5 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_540);
            peVar6 = std::
                     __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar5->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar6->mPimpl,units);
            peVar5 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_540);
            Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,UNIT_ATTRIBUTE_EXPONENT_VALUE);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_540);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_540);
          }
        }
        else {
          peVar3 = std::
                   __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_338);
          bVar2 = XmlAttribute::isType(peVar3,"multiplier","");
          if (bVar2) {
            peVar3 = std::
                     __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_338);
            XmlAttribute::value_abi_cxx11_(&local_680,peVar3);
            bVar2 = isCellMLReal(&local_680);
            std::__cxx11::string::~string((string *)&local_680);
            if (bVar2) {
              peVar3 = std::
                       __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_338);
              XmlAttribute::value_abi_cxx11_
                        ((string *)
                         &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,peVar3);
              bVar2 = convertToDouble((string *)
                                      &issue_4.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount,(double *)((long)&id.field_2 + 8));
              std::__cxx11::string::~string
                        ((string *)
                         &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                Issue::IssueImpl::create();
                peVar5 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_6b0);
                pIVar1 = peVar5->mPimpl;
                peVar4 = std::
                         __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)node);
                XmlNode::attribute_abi_cxx11_(&local_790,peVar4,"units");
                std::operator+(&local_770,"Unit referencing \'",&local_790);
                std::operator+(&local_750,&local_770,"\' in units \'");
                peVar7 = std::
                         __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)units);
                NamedEntity::name_abi_cxx11_(&local_7b0,&peVar7->super_NamedEntity);
                std::operator+(&local_730,&local_750,&local_7b0);
                std::operator+(&local_710,&local_730,"\' has a multiplier with the value \'");
                peVar3 = std::
                         __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_338);
                XmlAttribute::value_abi_cxx11_
                          ((string *)
                           &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,peVar3);
                std::operator+(&local_6f0,&local_710,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &issue_5.
                                super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
                std::operator+(&local_6d0,&local_6f0,
                               "\' that is a representation of a CellML real valued number, but out of range of the \'double\' type."
                              );
                Issue::IssueImpl::setDescription(pIVar1,&local_6d0);
                std::__cxx11::string::~string((string *)&local_6d0);
                std::__cxx11::string::~string((string *)&local_6f0);
                std::__cxx11::string::~string
                          ((string *)
                           &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__cxx11::string::~string((string *)&local_710);
                std::__cxx11::string::~string((string *)&local_730);
                std::__cxx11::string::~string((string *)&local_7b0);
                std::__cxx11::string::~string((string *)&local_750);
                std::__cxx11::string::~string((string *)&local_770);
                std::__cxx11::string::~string((string *)&local_790);
                peVar5 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_6b0);
                peVar6 = std::
                         __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&peVar5->mPimpl->mItem);
                AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar6->mPimpl,units);
                peVar5 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_6b0);
                Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_6b0);
                std::shared_ptr<libcellml::Issue>::~shared_ptr
                          ((shared_ptr<libcellml::Issue> *)local_6b0);
              }
            }
            else {
              Issue::IssueImpl::create();
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_7e0);
              pIVar1 = peVar5->mPimpl;
              peVar4 = std::
                       __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)node);
              XmlNode::attribute_abi_cxx11_(&local_8c0,peVar4,"units");
              std::operator+(&local_8a0,"Unit referencing \'",&local_8c0);
              std::operator+(&local_880,&local_8a0,"\' in units \'");
              peVar7 = std::
                       __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)units);
              NamedEntity::name_abi_cxx11_(&local_8e0,&peVar7->super_NamedEntity);
              std::operator+(&local_860,&local_880,&local_8e0);
              std::operator+(&local_840,&local_860,"\' has a multiplier with the value \'");
              peVar3 = std::
                       __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_338);
              XmlAttribute::value_abi_cxx11_(&local_900,peVar3);
              std::operator+(&local_820,&local_840,&local_900);
              std::operator+(&local_800,&local_820,
                             "\' that is not a representation of a CellML real valued number.");
              Issue::IssueImpl::setDescription(pIVar1,&local_800);
              std::__cxx11::string::~string((string *)&local_800);
              std::__cxx11::string::~string((string *)&local_820);
              std::__cxx11::string::~string((string *)&local_900);
              std::__cxx11::string::~string((string *)&local_840);
              std::__cxx11::string::~string((string *)&local_860);
              std::__cxx11::string::~string((string *)&local_8e0);
              std::__cxx11::string::~string((string *)&local_880);
              std::__cxx11::string::~string((string *)&local_8a0);
              std::__cxx11::string::~string((string *)&local_8c0);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_7e0);
              peVar6 = std::
                       __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar5->mPimpl->mItem);
              AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar6->mPimpl,units);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_7e0);
              Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_7e0);
              std::shared_ptr<libcellml::Issue>::~shared_ptr
                        ((shared_ptr<libcellml::Issue> *)local_7e0);
            }
          }
          else {
            bVar2 = isIdAttribute((XmlAttributePtr *)local_338,(bool)(this->mParsing1XVersion & 1));
            if (bVar2) {
              peVar3 = std::
                       __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_338);
              XmlAttribute::value_abi_cxx11_
                        ((string *)
                         &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,peVar3);
              std::__cxx11::string::operator=
                        ((string *)
                         &childNode.
                          super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,
                         (string *)
                         &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__cxx11::string::~string
                        ((string *)
                         &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              Issue::IssueImpl::create();
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_930);
              pIVar1 = peVar5->mPimpl;
              peVar4 = std::
                       __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)node);
              XmlNode::attribute_abi_cxx11_(&local_a10,peVar4,"units");
              std::operator+(&local_9f0,"Unit referencing \'",&local_a10);
              std::operator+(&local_9d0,&local_9f0,"\' in units \'");
              peVar7 = std::
                       __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)units);
              NamedEntity::name_abi_cxx11_(&local_a30,&peVar7->super_NamedEntity);
              std::operator+(&local_9b0,&local_9d0,&local_a30);
              std::operator+(&local_990,&local_9b0,"\' has an invalid attribute \'");
              peVar3 = std::
                       __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_338);
              XmlAttribute::name_abi_cxx11_(&local_a50,peVar3);
              std::operator+(&local_970,&local_990,&local_a50);
              std::operator+(&local_950,&local_970,"\'.");
              Issue::IssueImpl::setDescription(pIVar1,&local_950);
              std::__cxx11::string::~string((string *)&local_950);
              std::__cxx11::string::~string((string *)&local_970);
              std::__cxx11::string::~string((string *)&local_a50);
              std::__cxx11::string::~string((string *)&local_990);
              std::__cxx11::string::~string((string *)&local_9b0);
              std::__cxx11::string::~string((string *)&local_a30);
              std::__cxx11::string::~string((string *)&local_9d0);
              std::__cxx11::string::~string((string *)&local_9f0);
              std::__cxx11::string::~string((string *)&local_a10);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_930);
              peVar6 = std::
                       __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar5->mPimpl->mItem);
              AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar6->mPimpl,units);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_930);
              Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,UNIT_ATTRIBUTE_OPTIONAL);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_930);
              std::shared_ptr<libcellml::Issue>::~shared_ptr
                        ((shared_ptr<libcellml::Issue> *)local_930);
            }
          }
        }
      }
    }
    std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_338);
    XmlAttribute::next((XmlAttribute *)
                       &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    std::shared_ptr<libcellml::XmlAttribute>::operator=
              ((shared_ptr<libcellml::XmlAttribute> *)local_338,
               (shared_ptr<libcellml::XmlAttribute> *)
               &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
              ((shared_ptr<libcellml::XmlAttribute> *)
               &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  if ((local_339 & 1) == 0) {
    Issue::IssueImpl::create();
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a70);
    pIVar1 = peVar5->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a90,"Unit does not specify a units attribute.",&local_a91);
    Issue::IssueImpl::setDescription(pIVar1,&local_a90);
    std::__cxx11::string::~string((string *)&local_a90);
    std::allocator<char>::~allocator(&local_a91);
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a70);
    peVar6 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar5->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setUnits(peVar6->mPimpl,units);
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a70);
    Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,UNIT_UNITS);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_a70);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_a70);
  }
  peVar7 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)units);
  Units::addUnit(peVar7,(string *)((long)&prefix.field_2 + 8),(string *)local_60,multiplier,
                 (double)id.field_2._8_8_,
                 (string *)
                 &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
            ((shared_ptr<libcellml::XmlAttribute> *)local_338);
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)((long)&textNode.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Parser::ParserImpl::loadUnit(const UnitsPtr &units, const XmlNodePtr &node)
{
    std::string reference;
    std::string prefix = "0";
    double exponent = 1.0;
    double multiplier = 1.0;
    std::string id;
    // A unit should not have any children.
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an invalid child element '" + childNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
    // Parse the unit attributes.
    XmlAttributePtr attribute = node->firstAttribute();
    bool unitsAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("units")) {
            if (mParsing1XVersion) {
                reference = convertNonSiUnits(attribute->value());
            } else {
                reference = attribute->value();
            }
            unitsAttributePresent = true;
        } else if (attribute->isType("prefix")) {
            prefix = attribute->value();
        } else if (attribute->isType("exponent")) {
            if (isCellMLReal(attribute->value())) {
                if (!convertToDouble(attribute->value(), exponent)) {
                    // This value won't be saved for validation later, so it does need to be reported now.
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an exponent with the value '" + attribute->value() + "' that is a representation of a CellML real valued number, but out of range of the 'double' type.");
                    issue->mPimpl->mItem->mPimpl->setUnits(units);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_EXPONENT_VALUE);
                    addIssue(issue);
                }
            } else {
                // This value won't be saved for validation later, so it does need to be reported now.
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an exponent with the value '" + attribute->value() + "' that is not a representation of a CellML real valued number.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_EXPONENT_VALUE);
                addIssue(issue);
            }
        } else if (attribute->isType("multiplier")) {
            if (isCellMLReal(attribute->value())) {
                if (!convertToDouble(attribute->value(), multiplier)) {
                    // This value won't be saved for validation later, so it does need to be reported now.
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has a multiplier with the value '" + attribute->value() + "' that is a representation of a CellML real valued number, but out of range of the 'double' type.");
                    issue->mPimpl->mItem->mPimpl->setUnits(units);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
                    addIssue(issue);
                }
            } else {
                // This value won't be saved for validation later, so it does need to be reported now.
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has a multiplier with the value '" + attribute->value() + "' that is not a representation of a CellML real valued number.");
                issue->mPimpl->mItem->mPimpl->setUnits(units);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_MULTIPLIER_VALUE);
                addIssue(issue);
            }
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            id = attribute->value();
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Unit referencing '" + node->attribute("units") + "' in units '" + units->name() + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setUnits(units);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_ATTRIBUTE_OPTIONAL);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!unitsAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Unit does not specify a units attribute.");
        issue->mPimpl->mItem->mPimpl->setUnits(units);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::UNIT_UNITS);
        addIssue(issue);
    }

    // Add this unit to the parent units.
    units->addUnit(reference, prefix, exponent, multiplier, id);
}